

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test4.c
# Opt level: O0

void test_lot_of_adds(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  json_object *iobj;
  json_object *jobj;
  char key [50];
  uint local_c;
  int ii;
  
  lVar2 = json_object_new_object();
  if (lVar2 == 0) {
    __assert_fail("jobj != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test4.c",
                  0x27,"void test_lot_of_adds(void)");
  }
  local_c = 0;
  while( true ) {
    if (499 < (int)local_c) {
      uVar4 = json_object_to_json_string(lVar2);
      printf("%s\n",uVar4);
      iVar1 = json_object_object_length(lVar2);
      if (iVar1 == 500) {
        json_object_put(lVar2);
        return;
      }
      __assert_fail("json_object_object_length(jobj) == 500",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test4.c"
                    ,0x34,"void test_lot_of_adds(void)");
    }
    snprintf((char *)&jobj,0x32,"k%d",(ulong)local_c);
    lVar3 = json_object_new_int(local_c);
    if (lVar3 == 0) break;
    iVar1 = json_object_object_add(lVar2,&jobj,lVar3);
    if (iVar1 != 0) {
      fprintf(_stderr,"FAILED to add object #%d\n",(ulong)local_c);
      abort();
    }
    local_c = local_c + 1;
  }
  __assert_fail("iobj != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/tests/test4.c",
                0x2c,"void test_lot_of_adds(void)");
}

Assistant:

static void test_lot_of_adds(void)
{
	int ii;
	char key[50];
	json_object *jobj = json_object_new_object();
	assert(jobj != NULL);
	for (ii = 0; ii < 500; ii++)
	{
		snprintf(key, sizeof(key), "k%d", ii);
		json_object *iobj = json_object_new_int(ii);
		assert(iobj != NULL);
		if (json_object_object_add(jobj, key, iobj))
		{
			fprintf(stderr, "FAILED to add object #%d\n", ii);
			abort();
		}
	}
	printf("%s\n", json_object_to_json_string(jobj));
	assert(json_object_object_length(jobj) == 500);
	json_object_put(jobj);
}